

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsGraph.cxx
# Opt level: O1

ExpandMacroResult __thiscall
cmCMakePresetsGraphInternal::BaseMacroExpander::operator()
          (BaseMacroExpander *this,string *macroNamespace,string *macroName,string *macroOut,
          int version)

{
  int iVar1;
  string_view sVar2;
  string local_48;
  
  if (macroNamespace->_M_string_length != 0) {
    return Ignore;
  }
  iVar1 = std::__cxx11::string::compare((char *)macroName);
  if (iVar1 == 0) {
    std::__cxx11::string::_M_append
              ((char *)macroOut,(ulong)(this->Graph->SourceDir)._M_dataplus._M_p);
    return Ok;
  }
  iVar1 = std::__cxx11::string::compare((char *)macroName);
  if (iVar1 == 0) {
    cmsys::SystemTools::GetParentDirectory(&local_48,&this->Graph->SourceDir);
    std::__cxx11::string::_M_append((char *)macroOut,(ulong)local_48._M_dataplus._M_p);
  }
  else {
    iVar1 = std::__cxx11::string::compare((char *)macroName);
    if (iVar1 != 0) {
      iVar1 = std::__cxx11::string::compare((char *)macroName);
      if (iVar1 != 0) {
        iVar1 = std::__cxx11::string::compare((char *)macroName);
        if (iVar1 == 0) {
          if (2 < version) {
            sVar2 = cmSystemTools::GetSystemName();
            std::__cxx11::string::append((char *)macroOut,(ulong)sVar2._M_str);
            return Ok;
          }
          return Error;
        }
        iVar1 = std::__cxx11::string::compare((char *)macroName);
        if ((iVar1 == 0) &&
           ((this->File).
            super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
            ._M_payload.
            super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
            .
            super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ._M_engaged == true)) {
          if (version < 4) {
            return Error;
          }
          cmsys::SystemTools::GetParentDirectory(&local_48,(string *)&this->File);
          std::__cxx11::string::_M_append((char *)macroOut,(ulong)local_48._M_dataplus._M_p);
          goto LAB_002ea2be;
        }
        iVar1 = std::__cxx11::string::compare((char *)macroName);
        if (iVar1 != 0) {
          return Ignore;
        }
        if (version < 5) {
          return Error;
        }
        cmSystemTools::GetSystemPathlistSeparator();
      }
      std::__cxx11::string::push_back((char)macroOut);
      return Ok;
    }
    cmsys::SystemTools::GetFilenameName(&local_48,&this->Graph->SourceDir);
    std::__cxx11::string::_M_append((char *)macroOut,(ulong)local_48._M_dataplus._M_p);
  }
LAB_002ea2be:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  return Ok;
}

Assistant:

ExpandMacroResult BaseMacroExpander::operator()(
  const std::string& macroNamespace, const std::string& macroName,
  std::string& macroOut, int version) const
{
  if (macroNamespace.empty()) {
    if (macroName == "sourceDir") {
      macroOut += Graph.SourceDir;
      return ExpandMacroResult::Ok;
    }
    if (macroName == "sourceParentDir") {
      macroOut += cmSystemTools::GetParentDirectory(Graph.SourceDir);
      return ExpandMacroResult::Ok;
    }
    if (macroName == "sourceDirName") {
      macroOut += cmSystemTools::GetFilenameName(Graph.SourceDir);
      return ExpandMacroResult::Ok;
    }
    if (macroName == "dollar") {
      macroOut += '$';
      return ExpandMacroResult::Ok;
    }
    if (macroName == "hostSystemName") {
      if (version < 3) {
        return ExpandMacroResult::Error;
      }
      macroOut += cmSystemTools::GetSystemName();
      return ExpandMacroResult::Ok;
    }
    // Enable fileDir macro expansion for non-preset expanders
    if (macroName == "fileDir" && File) {
      if (version < 4) {
        return ExpandMacroResult::Error;
      }
      macroOut += cmSystemTools::GetParentDirectory(File.value());
      return ExpandMacroResult::Ok;
    }
    if (macroName == "pathListSep") {
      if (version < 5) {
        return ExpandMacroResult::Error;
      }
      macroOut += cmSystemTools::GetSystemPathlistSeparator();
      return ExpandMacroResult::Ok;
    }
  }

  return ExpandMacroResult::Ignore;
}